

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O2

bool __thiscall
iDynTree::KinDynComputations::getCenterOfMassVelocity
          (KinDynComputations *this,Span<double,__1L> vel)

{
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> local_58;
  pointer local_48;
  undefined8 local_40;
  Vector3 local_30;
  
  if (vel.storage_.super_extent_type<_1L>.size_.size_ == 3) {
    getCenterOfMassVelocity(&local_30,this);
    local_40 = 3;
    local_58.
    super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
    .m_data = local_30.m_data;
    local_48 = vel.storage_.data_;
    Eigen::internal::
    call_assignment<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
              ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)&local_48,
               &local_58);
  }
  else {
    iDynTree::reportError("KinDynComputations","getCenterOfMassVelocity","Wrong size in input vel");
  }
  return vel.storage_.super_extent_type<_1L>.size_.size_ == 3;
}

Assistant:

bool KinDynComputations::getCenterOfMassVelocity(Span<double> vel)
{
    constexpr int expected_velocity_size = 3;
    bool ok = vel.size() == expected_velocity_size;
    if( !ok )
    {
        reportError("KinDynComputations","getCenterOfMassVelocity","Wrong size in input vel");
        return false;
    }

    toEigen(vel) = toEigen(getCenterOfMassVelocity());

    return true;
}